

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_6::InSliceInfo::InSliceInfo
          (InSliceInfo *this,PixelType tifb,PixelType tifl,char *b,size_t xs,size_t ys,int xsm,
          int ysm,bool f,bool s,double fv)

{
  double fv_local;
  bool s_local;
  bool f_local;
  size_t ys_local;
  size_t xs_local;
  char *b_local;
  PixelType tifl_local;
  PixelType tifb_local;
  InSliceInfo *this_local;
  
  this->typeInFrameBuffer = tifb;
  this->typeInFile = tifl;
  this->base = b;
  this->xStride = xs;
  this->yStride = ys;
  this->xSampling = xsm;
  this->ySampling = ysm;
  this->fill = f;
  this->skip = s;
  this->fillValue = fv;
  return;
}

Assistant:

InSliceInfo::InSliceInfo (PixelType tifb,
			  PixelType tifl,
			  char *b,
			  size_t xs, size_t ys,
			  int xsm, int ysm,
			  bool f, bool s,
			  double fv)
:
    typeInFrameBuffer (tifb),
    typeInFile (tifl),
    base (b),
    xStride (xs),
    yStride (ys),
    xSampling (xsm),
    ySampling (ysm),
    fill (f),
    skip (s),
    fillValue (fv)
{
    // empty
}